

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O1

void prvTidyReleaseStreamOut(TidyDocImpl *doc,StreamOut *out)

{
  if (((out != &stdoutStreamOut) && (out != (StreamOut *)0x0)) && (out != &stderrStreamOut)) {
    if (out->iotype == FileIO) {
      fclose((FILE *)(out->sink).sinkData);
    }
    (*doc->allocator->vtbl->free)(doc->allocator,out);
    return;
  }
  return;
}

Assistant:

void  TY_(ReleaseStreamOut)( TidyDocImpl *doc,  StreamOut* out )
{
    if ( out && out != &stderrStreamOut && out != &stdoutStreamOut )
    {
        if ( out->iotype == FileIO )
            fclose( (FILE*) out->sink.sinkData );
        TidyDocFree( doc, out );
    }
}